

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetrepaintmanager.cpp
# Opt level: O0

void __thiscall QWidgetRepaintManager::paintAndFlush(QWidgetRepaintManager *this)

{
  QSize *pQVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  QDebug *pQVar6;
  long lVar7;
  qsizetype qVar8;
  const_reference ppQVar9;
  ulong uVar10;
  pointer pQVar11;
  QTLWExtra *sharedPainter;
  QWidget *pQVar12;
  pointer pQVar13;
  size_type sVar14;
  reference ppQVar15;
  QWidgetPrivate *pQVar16;
  byte bVar17;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  undefined1 auVar18 [16];
  QWidgetPrivate *wd_1;
  QWidget *w_4;
  int i_6;
  QRect *rect_1;
  const_iterator __end2;
  const_iterator __begin2;
  QRegion *__range2;
  int i_5;
  int i_4;
  unique_ptr<QPlatformTextureList,_std::default_delete<QPlatformTextureList>_> *tl;
  vector<std::unique_ptr<QPlatformTextureList,_std::default_delete<QPlatformTextureList>_>,_std::allocator<std::unique_ptr<QPlatformTextureList,_std::default_delete<QPlatformTextureList>_>_>_>
  *__range1;
  QWidget *npw;
  QWidget *w_2;
  int i_3;
  int i_2;
  int numPaintPending;
  QTLWExtra *tlwExtra;
  QWidgetPrivate *wd;
  int i_1;
  int i;
  QPlatformIntegration *integration;
  bool repaintAllWidgets;
  bool updatesDisabled;
  DrawWidgetFlags flags_1;
  QPoint offset;
  QRegion toBePainted;
  DrawWidgetFlags flags;
  QRegion dirtyCopy;
  QRect rect;
  QWidget *w_3;
  iterator __end1;
  iterator __begin1;
  QWidget *w_1;
  QRegion widgetDirty;
  QRegion dirtyBeforeSubtractedOpaqueChildren;
  bool hasDirtySiblingsAbove;
  QWidget *w;
  QRegion toClean;
  QRegion newVisible;
  QRegion staticRegion;
  QRect clipRect;
  QRect tlwRect;
  QLoggingCategoryMacroHolder<(QtMsgType)4> qt_category;
  QVarLengthArray<QWidget_*,_16LL> paintPending;
  QVarLengthArray<QWidget_*,_32LL> opaqueNonOverlappedWidgets;
  QWidget *in_stack_fffffffffffffad8;
  DrawWidgetFlag other;
  QWidgetPrivate *in_stack_fffffffffffffae0;
  QWidgetPrivate *in_stack_fffffffffffffae8;
  QWidgetPrivate *in_stack_fffffffffffffaf0;
  QWidgetPrivate *in_stack_fffffffffffffaf8;
  value_type pQVar19;
  QWidget *in_stack_fffffffffffffb00;
  QWidgetPrivate *in_stack_fffffffffffffb18;
  undefined4 in_stack_fffffffffffffb24;
  bool *in_stack_fffffffffffffb28;
  QWidgetPrivate *in_stack_fffffffffffffb30;
  QWidgetPrivate *in_stack_fffffffffffffb38;
  undefined7 in_stack_fffffffffffffb40;
  undefined1 in_stack_fffffffffffffb47;
  QWidget *in_stack_fffffffffffffb48;
  QWidgetRepaintManager *in_stack_fffffffffffffb50;
  byte local_46a;
  bool local_469;
  int local_44c;
  long local_438;
  int local_428;
  int local_424;
  int local_3fc;
  int local_3f8;
  undefined4 in_stack_fffffffffffffc18;
  undefined4 in_stack_fffffffffffffc1c;
  QWidgetPrivate *in_stack_fffffffffffffc20;
  int iVar20;
  int in_stack_fffffffffffffc2c;
  QWidgetPrivate *in_stack_fffffffffffffc30;
  QRegion local_388;
  QFlagsStorage<QWidgetPrivate::DrawWidgetFlag> local_37c;
  QRegion local_378;
  QRegion local_370 [5];
  QRegion local_348;
  undefined1 local_340 [16];
  undefined8 local_330;
  unique_ptr<QPlatformTextureList,_std::default_delete<QPlatformTextureList>_> *local_328;
  __normal_iterator<std::unique_ptr<QPlatformTextureList,_std::default_delete<QPlatformTextureList>_>_*,_std::vector<std::unique_ptr<QPlatformTextureList,_std::default_delete<QPlatformTextureList>_>,_std::allocator<std::unique_ptr<QPlatformTextureList,_std::default_delete<QPlatformTextureList>_>_>_>_>
  local_320;
  QRegion local_318;
  QRect local_310;
  QRegion local_300;
  QWidget *local_2f8;
  undefined1 local_2f0 [16];
  QPoint local_2d8;
  QRegion local_2d0;
  QRect local_2c8;
  QRegion local_2b8;
  byte local_2a9;
  QRect local_2a8;
  QWidget *local_298;
  QRegion local_290;
  QSize local_288;
  QSize local_280;
  undefined8 local_278;
  QRegion local_270;
  QRegion local_268;
  QRegion local_260;
  undefined8 local_258;
  undefined1 *local_248;
  undefined1 *local_240;
  undefined8 local_238;
  QSize local_230;
  undefined8 local_228;
  undefined8 local_220;
  undefined8 local_218;
  QDebug local_1f0;
  QDebug local_1e8;
  QDebug local_1e0;
  QDebug local_1d8;
  QDebug local_1d0;
  undefined1 *local_1c8;
  undefined1 local_1c0;
  undefined7 uStack_1bf;
  undefined1 local_1b8 [84];
  QFlagsStorage<QWidgetPrivate::DrawWidgetFlag> in_stack_fffffffffffffe9c;
  QWidgetRepaintManager *in_stack_fffffffffffffed0;
  QVarLengthArray<QWidget_*,_32LL> local_120;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_1c8 = &DAT_aaaaaaaaaaaaaaaa;
  local_1c0 = 0xaa;
  uStack_1bf = 0xaaaaaaaaaaaaaa;
  QtPrivateLogging::lcWidgetPainting();
  anon_unknown.dwarf_2950bb::QLoggingCategoryMacroHolder<(QtMsgType)4>::QLoggingCategoryMacroHolder
            ((QLoggingCategoryMacroHolder<(QtMsgType)4> *)in_stack_fffffffffffffae0,
             (QLoggingCategory *)in_stack_fffffffffffffad8);
  while (bVar2 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                           ((QLoggingCategoryMacroHolder *)&local_1c8), bVar2) {
    anon_unknown.dwarf_2950bb::QLoggingCategoryMacroHolder<(QtMsgType)4>::name
              ((QLoggingCategoryMacroHolder<(QtMsgType)4> *)0x3a77fa);
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)in_stack_fffffffffffffaf0,(char *)in_stack_fffffffffffffae8,
               (int)((ulong)in_stack_fffffffffffffae0 >> 0x20),(char *)in_stack_fffffffffffffad8,
               (char *)0x3a7813);
    QMessageLogger::info();
    QDebug::operator<<((QDebug *)in_stack_fffffffffffffaf8,in_stack_fffffffffffffb28);
    pQVar6 = QDebug::operator<<((QDebug *)in_stack_fffffffffffffaf8,in_stack_fffffffffffffb28);
    QDebug::QDebug(&local_1e8,pQVar6);
    ::operator<<((QDebug *)&local_1e0,(QRegion *)&local_1e8);
    pQVar6 = QDebug::operator<<((QDebug *)in_stack_fffffffffffffaf8,in_stack_fffffffffffffb28);
    QDebug::QDebug(&local_1d8,pQVar6);
    ::operator<<((QDebug *)in_stack_fffffffffffffaf8,(QList<QWidget_*> *)in_stack_fffffffffffffaf0);
    QDebug::~QDebug(&local_1d0);
    QDebug::~QDebug(&local_1d8);
    QDebug::~QDebug(&local_1e0);
    QDebug::~QDebug(&local_1e8);
    QDebug::~QDebug(&local_1f0);
    local_1c0 = 0;
  }
  bVar2 = QWidget::updatesEnabled((QWidget *)0x3a791f);
  bVar17 = (bVar2 ^ 0xffU) & 1;
  bVar2 = false;
  local_220 = *(undefined8 *)(*(long *)(*(long *)in_RDI + 0x20) + 0x14);
  local_218 = *(undefined8 *)(*(long *)(*(long *)in_RDI + 0x20) + 0x1c);
  local_469 = false;
  if (bVar17 == 0) {
    local_228 = QBackingStore::size();
    local_230 = QRect::size((QRect *)in_stack_fffffffffffffaf0);
    local_469 = ::operator!=((QSize *)in_stack_fffffffffffffae0,(QSize *)in_stack_fffffffffffffad8);
  }
  if (local_469 != false) {
    in_stack_fffffffffffffc30 = (QWidgetPrivate *)QGuiApplicationPrivate::platformIntegration();
    bVar3 = hasStaticContents((QWidgetRepaintManager *)0x3a7a02);
    local_46a = 0;
    if (bVar3) {
      local_238 = QBackingStore::size();
      bVar3 = QSize::isEmpty((QSize *)in_stack_fffffffffffffaf0);
      local_46a = 0;
      if (!bVar3) {
        local_46a = (**(code **)(*(long *)in_stack_fffffffffffffc30 + 0x10))
                              (in_stack_fffffffffffffc30,0x19);
      }
    }
    if ((local_46a & 1) == 0) {
      iVar20 = QRect::width((QRect *)in_stack_fffffffffffffad8);
      iVar4 = QRect::height((QRect *)in_stack_fffffffffffffad8);
      QRegion::QRegion(&local_270,0,0,iVar20,iVar4,Rectangle);
      QRegion::operator=((QRegion *)in_stack_fffffffffffffae0,(QRegion *)in_stack_fffffffffffffad8);
      QRegion::~QRegion(&local_270);
      for (in_stack_fffffffffffffc2c = 0; lVar7 = (long)in_stack_fffffffffffffc2c,
          qVar8 = QList<QWidget_*>::size((QList<QWidget_*> *)&in_RDI->field_0x18), lVar7 < qVar8;
          in_stack_fffffffffffffc2c = in_stack_fffffffffffffc2c + 1) {
        QList<QWidget_*>::at
                  ((QList<QWidget_*> *)in_stack_fffffffffffffae0,
                   (qsizetype)in_stack_fffffffffffffad8);
        resetWidget((QWidgetRepaintManager *)in_stack_fffffffffffffae0,in_stack_fffffffffffffad8);
      }
      QList<QWidget_*>::clear((QList<QWidget_*> *)in_stack_fffffffffffffae0);
      bVar2 = true;
    }
    else {
      local_248 = &DAT_aaaaaaaaaaaaaaaa;
      local_240 = &DAT_aaaaaaaaaaaaaaaa;
      QPoint::QPoint((QPoint *)in_stack_fffffffffffffae0,
                     (int)((ulong)in_stack_fffffffffffffad8 >> 0x20),(int)in_stack_fffffffffffffad8)
      ;
      local_258 = QBackingStore::size();
      QRect::QRect((QRect *)in_stack_fffffffffffffb00,(QPoint *)in_stack_fffffffffffffaf8,
                   (QSize *)in_stack_fffffffffffffaf0);
      local_260.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
      staticContents(in_stack_fffffffffffffb50,in_stack_fffffffffffffb48,
                     (QRect *)CONCAT17(in_stack_fffffffffffffb47,in_stack_fffffffffffffb40));
      local_268.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
      iVar20 = QRect::width((QRect *)in_stack_fffffffffffffad8);
      iVar4 = QRect::height((QRect *)in_stack_fffffffffffffad8);
      QRegion::QRegion(&local_268,0,0,iVar20,iVar4,Rectangle);
      QRegion::operator-=(&local_268,(QRegion *)&local_260);
      QRegion::operator+=((QRegion *)
                          &((anon_union_4_2_7218e939_for_QLoggingCategory_2 *)
                           &in_RDI->super_QPaintDevice)->bools,(QRegion *)&local_268);
      QBackingStore::setStaticContents(*(QRegion **)&in_RDI->field_0x8);
      QRegion::~QRegion(&local_268);
      QRegion::~QRegion(&local_260);
    }
  }
  local_278 = QBackingStore::size();
  local_280 = QRect::size((QRect *)in_stack_fffffffffffffaf0);
  bVar3 = ::operator!=((QSize *)in_stack_fffffffffffffae0,(QSize *)in_stack_fffffffffffffad8);
  if (bVar3) {
    pQVar1 = *(QSize **)&in_RDI->field_0x8;
    local_288 = QRect::size((QRect *)in_stack_fffffffffffffaf0);
    QBackingStore::resize(pQVar1);
  }
  if (bVar17 != 0) goto LAB_003a8d4a;
  local_290.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
  QRegion::QRegion(&local_290,(QRegion *)&in_RDI->super_QPaintDevice);
  memset(&local_120,0xaa,0x118);
  QVarLengthArray<QWidget_*,_32LL>::QVarLengthArray(&local_120);
  iVar20 = 0;
  while( true ) {
    lVar7 = (long)iVar20;
    qVar8 = QList<QWidget_*>::size((QList<QWidget_*> *)&in_RDI->field_0x18);
    if (qVar8 <= lVar7) break;
    ppQVar9 = QList<QWidget_*>::at
                        ((QList<QWidget_*> *)in_stack_fffffffffffffae0,
                         (qsizetype)in_stack_fffffffffffffad8);
    local_298 = *ppQVar9;
    in_stack_fffffffffffffc20 = QWidget::d_func((QWidget *)0x3a7e0c);
    if ((*(uint *)&(in_stack_fffffffffffffc20->data).field_0x10 >> 0x12 & 1) == 0) {
      local_2a8 = QWidgetPrivate::clipRect(in_stack_fffffffffffffb18);
      QRegion::operator&=(&in_stack_fffffffffffffc20->dirty,(QRect *)&local_2a8);
      QWidgetPrivate::clipToEffectiveMask
                (in_stack_fffffffffffffaf8,(QRegion *)in_stack_fffffffffffffaf0);
      local_2a9 = 0;
      if ((*(uint *)&in_stack_fffffffffffffc20->field_0x250 >> 0x15 & 1) == 0) {
        QWidgetPrivate::subtractOpaqueSiblings
                  (in_stack_fffffffffffffb38,(QRegion *)in_stack_fffffffffffffb30,
                   in_stack_fffffffffffffb28,SUB41((uint)in_stack_fffffffffffffb24 >> 0x18,0));
      }
      local_2b8.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
      QRegion::QRegion(&local_2b8,(QRegion *)&in_stack_fffffffffffffc20->dirty);
      if (((*(uint *)&in_stack_fffffffffffffc20->field_0x250 >> 0x14 & 1) == 0) &&
         ((*(uint *)&in_stack_fffffffffffffc20->field_0x250 >> 0x15 & 1) == 0)) {
        local_2c8 = QWidget::rect((QWidget *)in_stack_fffffffffffffaf8);
        QWidgetPrivate::subtractOpaqueChildren
                  (in_stack_fffffffffffffaf0,(QRegion *)in_stack_fffffffffffffae8,
                   (QRect *)in_stack_fffffffffffffae0);
      }
      uVar10 = QRegion::isEmpty();
      if (((uVar10 & 1) != 0) &&
         ((*(uint *)&in_stack_fffffffffffffc20->field_0x250 >> 0x19 & 1) != 0)) {
        QRegion::operator=(&in_stack_fffffffffffffc20->dirty,(QRegion *)&local_2b8);
      }
      uVar10 = QRegion::isEmpty();
      if ((uVar10 & 1) == 0) {
        local_2d0.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
        if (local_298 == *(QWidget **)in_RDI) {
          QRegion::QRegion(&local_2d0,(QRegion *)&in_stack_fffffffffffffc20->dirty);
        }
        else {
          QPoint::QPoint((QPoint *)in_stack_fffffffffffffae0);
          local_2d8 = QWidget::mapTo(in_stack_fffffffffffffb00,(QWidget *)in_stack_fffffffffffffaf8,
                                     (QPoint *)in_stack_fffffffffffffaf0);
          QRegion::translated((QRegion *)in_stack_fffffffffffffaf8,
                              (QPoint *)in_stack_fffffffffffffaf0);
        }
        QRegion::operator+=(&local_290,(QRegion *)&local_2d0);
        QWidget::d_func((QWidget *)0x3a80fd);
        pQVar11 = std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::operator->
                            ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x3a8109);
        if (pQVar11->proxyWidget == (QGraphicsProxyWidget *)0x0) {
          bVar3 = isDrawnInEffect(in_stack_fffffffffffffad8);
          bVar17 = 0;
          if (((!bVar3) && (bVar17 = 0, (local_2a9 & 1) == 0)) &&
             (bVar17 = 0, (*(uint *)&in_stack_fffffffffffffc20->field_0x250 >> 0x11 & 1) != 0)) {
            in_stack_fffffffffffffb38 = (QWidgetPrivate *)&in_RDI->super_QPaintDevice;
            auVar18 = QRegion::boundingRect();
            local_2f0 = auVar18;
            bVar17 = QRegion::intersects((QRect *)in_stack_fffffffffffffb38);
            bVar17 = bVar17 ^ 0xff;
          }
          if ((bVar17 & 1) == 0) {
            resetWidget((QWidgetRepaintManager *)in_stack_fffffffffffffae0,in_stack_fffffffffffffad8
                       );
            QRegion::operator+=((QRegion *)
                                &((anon_union_4_2_7218e939_for_QLoggingCategory_2 *)
                                 &in_RDI->super_QPaintDevice)->bools,(QRegion *)&local_2d0);
          }
          else {
            QVarLengthArray<QWidget_*,_32LL>::append
                      ((QVarLengthArray<QWidget_*,_32LL> *)in_stack_fffffffffffffaf0,
                       (QWidget **)in_stack_fffffffffffffae8);
          }
          in_stack_fffffffffffffc1c = 0;
        }
        else {
          resetWidget((QWidgetRepaintManager *)in_stack_fffffffffffffae0,in_stack_fffffffffffffad8);
          in_stack_fffffffffffffc1c = 10;
        }
        QRegion::~QRegion(&local_2d0);
      }
      else {
        resetWidget((QWidgetRepaintManager *)in_stack_fffffffffffffae0,in_stack_fffffffffffffad8);
        in_stack_fffffffffffffc1c = 10;
      }
      QRegion::~QRegion(&local_2b8);
    }
    iVar20 = iVar20 + 1;
  }
  QList<QWidget_*>::clear((QList<QWidget_*> *)in_stack_fffffffffffffae0);
  QWidget::d_func((QWidget *)0x3a8280);
  sharedPainter = QWidgetPrivate::topData(in_stack_fffffffffffffae0);
  std::
  vector<std::unique_ptr<QPlatformTextureList,_std::default_delete<QPlatformTextureList>_>,_std::allocator<std::unique_ptr<QPlatformTextureList,_std::default_delete<QPlatformTextureList>_>_>_>
  ::clear((vector<std::unique_ptr<QPlatformTextureList,_std::default_delete<QPlatformTextureList>_>,_std::allocator<std::unique_ptr<QPlatformTextureList,_std::default_delete<QPlatformTextureList>_>_>_>
           *)0x3a82a4);
  findAllTextureWidgetsRecursively(in_stack_fffffffffffffb00,(QWidget *)in_stack_fffffffffffffaf8);
  uVar10 = QRegion::isEmpty();
  if ((uVar10 & 1) == 0) {
    local_320._M_current =
         (unique_ptr<QPlatformTextureList,_std::default_delete<QPlatformTextureList>_> *)
         &DAT_aaaaaaaaaaaaaaaa;
    local_320._M_current =
         (unique_ptr<QPlatformTextureList,_std::default_delete<QPlatformTextureList>_> *)
         std::
         vector<std::unique_ptr<QPlatformTextureList,_std::default_delete<QPlatformTextureList>_>,_std::allocator<std::unique_ptr<QPlatformTextureList,_std::default_delete<QPlatformTextureList>_>_>_>
         ::begin((vector<std::unique_ptr<QPlatformTextureList,_std::default_delete<QPlatformTextureList>_>,_std::allocator<std::unique_ptr<QPlatformTextureList,_std::default_delete<QPlatformTextureList>_>_>_>
                  *)in_stack_fffffffffffffae0);
    local_328 = (unique_ptr<QPlatformTextureList,_std::default_delete<QPlatformTextureList>_> *)
                &DAT_aaaaaaaaaaaaaaaa;
    local_328 = (unique_ptr<QPlatformTextureList,_std::default_delete<QPlatformTextureList>_> *)
                std::
                vector<std::unique_ptr<QPlatformTextureList,_std::default_delete<QPlatformTextureList>_>,_std::allocator<std::unique_ptr<QPlatformTextureList,_std::default_delete<QPlatformTextureList>_>_>_>
                ::end((vector<std::unique_ptr<QPlatformTextureList,_std::default_delete<QPlatformTextureList>_>,_std::allocator<std::unique_ptr<QPlatformTextureList,_std::default_delete<QPlatformTextureList>_>_>_>
                       *)in_stack_fffffffffffffae0);
    while( true ) {
      bVar3 = __gnu_cxx::operator!=
                        ((__normal_iterator<std::unique_ptr<QPlatformTextureList,_std::default_delete<QPlatformTextureList>_>_*,_std::vector<std::unique_ptr<QPlatformTextureList,_std::default_delete<QPlatformTextureList>_>,_std::allocator<std::unique_ptr<QPlatformTextureList,_std::default_delete<QPlatformTextureList>_>_>_>_>
                          *)in_stack_fffffffffffffae0,
                         (__normal_iterator<std::unique_ptr<QPlatformTextureList,_std::default_delete<QPlatformTextureList>_>_*,_std::vector<std::unique_ptr<QPlatformTextureList,_std::default_delete<QPlatformTextureList>_>,_std::allocator<std::unique_ptr<QPlatformTextureList,_std::default_delete<QPlatformTextureList>_>_>_>_>
                          *)in_stack_fffffffffffffad8);
      if (!bVar3) break;
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<QPlatformTextureList,_std::default_delete<QPlatformTextureList>_>_*,_std::vector<std::unique_ptr<QPlatformTextureList,_std::default_delete<QPlatformTextureList>_>,_std::allocator<std::unique_ptr<QPlatformTextureList,_std::default_delete<QPlatformTextureList>_>_>_>_>
      ::operator*(&local_320);
      local_424 = 0;
      while( true ) {
        iVar4 = local_424;
        std::unique_ptr<QPlatformTextureList,_std::default_delete<QPlatformTextureList>_>::
        operator->((unique_ptr<QPlatformTextureList,_std::default_delete<QPlatformTextureList>_> *)
                   0x3a862c);
        iVar5 = QPlatformTextureList::count();
        if (iVar5 <= iVar4) break;
        pQVar13 = std::unique_ptr<QPlatformTextureList,_std::default_delete<QPlatformTextureList>_>
                  ::operator->((unique_ptr<QPlatformTextureList,_std::default_delete<QPlatformTextureList>_>
                                *)0x3a864f);
        local_330 = QPlatformTextureList::source((int)pQVar13);
        bVar3 = QListSpecialMethodsBase<QWidget*>::contains<QWidget*>
                          ((QListSpecialMethodsBase<QWidget_*> *)in_stack_fffffffffffffae0,
                           (QWidget **)in_stack_fffffffffffffad8);
        if (bVar3) {
          local_340._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_340._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
          pQVar13 = std::
                    unique_ptr<QPlatformTextureList,_std::default_delete<QPlatformTextureList>_>::
                    operator->((unique_ptr<QPlatformTextureList,_std::default_delete<QPlatformTextureList>_>
                                *)0x3a86b3);
          local_340 = QPlatformTextureList::geometry((int)pQVar13);
          pQVar16 = QWidget::d_func((QWidget *)0x3a86df);
          *(uint *)&pQVar16->field_0x250 = *(uint *)&pQVar16->field_0x250 & 0xf7ffffff | 0x8000000;
          QRegion::operator+=((QRegion *)
                              &((anon_union_4_2_7218e939_for_QLoggingCategory_2 *)
                               &in_RDI->super_QPaintDevice)->bools,(QRect *)local_340);
          QRegion::operator+=(&local_290,(QRect *)local_340);
        }
        local_424 = local_424 + 1;
      }
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<QPlatformTextureList,_std::default_delete<QPlatformTextureList>_>_*,_std::vector<std::unique_ptr<QPlatformTextureList,_std::default_delete<QPlatformTextureList>_>,_std::allocator<std::unique_ptr<QPlatformTextureList,_std::default_delete<QPlatformTextureList>_>_>_>_>
      ::operator++(&local_320);
    }
    local_428 = 0;
    while( true ) {
      lVar7 = (long)local_428;
      qVar8 = QList<QWidget_*>::size((QList<QWidget_*> *)&in_RDI[1].field_0x8);
      if (qVar8 <= lVar7) break;
      QList<QWidget_*>::at
                ((QList<QWidget_*> *)in_stack_fffffffffffffae0,(qsizetype)in_stack_fffffffffffffad8)
      ;
      resetWidget((QWidgetRepaintManager *)in_stack_fffffffffffffae0,in_stack_fffffffffffffad8);
      local_428 = local_428 + 1;
    }
    QList<QWidget_*>::clear((QList<QWidget_*> *)in_stack_fffffffffffffae0);
    QWidget::d_func((QWidget *)0x3a87e4);
    pQVar11 = std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::operator->
                        ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x3a87f0);
    if (pQVar11->proxyWidget == (QGraphicsProxyWidget *)0x0) {
      QBackingStore::beginPaint(*(QRegion **)&in_RDI->field_0x8);
      updateStaticContentsSize((QWidgetRepaintManager *)in_stack_fffffffffffffaf0);
      local_370[0].d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
      QRegion::QRegion(local_370,(QRegion *)&in_RDI->super_QPaintDevice);
      QRegion::QRegion(&local_378);
      QRegion::operator=((QRegion *)in_stack_fffffffffffffae0,(QRegion *)in_stack_fffffffffffffad8);
      QRegion::~QRegion(&local_378);
      (((anon_union_4_2_7218e939_for_QLoggingCategory_2 *)&in_RDI[3].super_QPaintDevice)->bools).
      enabledDebug._q_value._M_base._M_i = false;
      local_44c = 0;
      while( true ) {
        sVar14 = QVLABaseBase::size((QVLABaseBase *)&local_120);
        if (sVar14 <= local_44c) break;
        ppQVar15 = QVLABase<QWidget_*>::operator[]
                             ((QVLABase<QWidget_*> *)in_stack_fffffffffffffad8,0x3a8a22);
        pQVar19 = *ppQVar15;
        pQVar16 = QWidget::d_func((QWidget *)0x3a8a3a);
        local_37c.i = 0xaaaaaaaa;
        QFlags<QWidgetPrivate::DrawWidgetFlag>::QFlags
                  ((QFlags<QWidgetPrivate::DrawWidgetFlag> *)in_stack_fffffffffffffae0,
                   (DrawWidgetFlag)((ulong)in_stack_fffffffffffffad8 >> 0x20));
        if (((*(uint *)&pQVar16->field_0x250 >> 0x14 & 1) == 0) &&
           ((*(uint *)&pQVar16->field_0x250 >> 0x15 & 1) == 0)) {
          QFlags<QWidgetPrivate::DrawWidgetFlag>::operator|=
                    ((QFlags<QWidgetPrivate::DrawWidgetFlag> *)&local_37c,DontDrawOpaqueChildren);
        }
        if (pQVar19 == *(value_type *)in_RDI) {
          QFlags<QWidgetPrivate::DrawWidgetFlag>::operator|=
                    ((QFlags<QWidgetPrivate::DrawWidgetFlag> *)&local_37c,DrawAsRoot);
        }
        local_388.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
        QRegion::QRegion(&local_388,(QRegion *)&pQVar16->dirty);
        resetWidget((QWidgetRepaintManager *)in_stack_fffffffffffffae0,in_stack_fffffffffffffad8);
        QPoint::QPoint((QPoint *)in_stack_fffffffffffffae0);
        if (pQVar19 != *(value_type *)in_RDI) {
          pQVar12 = *(QWidget **)in_RDI;
          QPoint::QPoint((QPoint *)in_stack_fffffffffffffae0);
          QWidget::mapTo(pQVar12,pQVar19,(QPoint *)in_stack_fffffffffffffaf0);
          QPoint::operator+=((QPoint *)in_stack_fffffffffffffae0,(QPoint *)in_stack_fffffffffffffad8
                            );
        }
        QBackingStore::paintDevice();
        in_stack_fffffffffffffad8 = in_RDI;
        QWidgetPrivate::drawWidget
                  (in_stack_fffffffffffffc30,
                   (QPaintDevice *)CONCAT44(in_stack_fffffffffffffc2c,iVar20),
                   (QRegion *)in_stack_fffffffffffffc20,
                   (QPoint *)CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18),
                   (DrawWidgetFlags)in_stack_fffffffffffffe9c.i,(QPainter *)sharedPainter,
                   in_stack_fffffffffffffed0);
        QRegion::~QRegion(&local_388);
        local_44c = local_44c + 1;
        in_stack_fffffffffffffaf0 = pQVar16;
      }
      if (bVar2) {
LAB_003a8c3d:
        other = (DrawWidgetFlag)((ulong)in_stack_fffffffffffffad8 >> 0x20);
        ::operator|((enum_type)((ulong)in_stack_fffffffffffffae0 >> 0x20),
                    (enum_type)in_stack_fffffffffffffae0);
        QFlags<QWidgetPrivate::DrawWidgetFlag>::operator|
                  ((QFlags<QWidgetPrivate::DrawWidgetFlag> *)in_stack_fffffffffffffae0,other);
        in_stack_fffffffffffffae0 = QWidget::d_func((QWidget *)0x3a8c8b);
        QBackingStore::paintDevice();
        QPoint::QPoint((QPoint *)in_stack_fffffffffffffae0);
        QWidgetPrivate::drawWidget
                  (in_stack_fffffffffffffc30,
                   (QPaintDevice *)CONCAT44(in_stack_fffffffffffffc2c,iVar20),
                   (QRegion *)in_stack_fffffffffffffc20,
                   (QPoint *)CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18),
                   (DrawWidgetFlags)in_stack_fffffffffffffe9c.i,(QPainter *)sharedPainter,
                   in_stack_fffffffffffffed0);
      }
      else {
        uVar10 = QRegion::isEmpty();
        if ((uVar10 & 1) == 0) goto LAB_003a8c3d;
      }
      QBackingStore::endPaint();
      flush((QWidgetRepaintManager *)in_stack_fffffffffffffb30);
      QRegion::~QRegion(local_370);
    }
    else {
      updateStaticContentsSize((QWidgetRepaintManager *)in_stack_fffffffffffffaf0);
      QRegion::QRegion(&local_348);
      QRegion::operator=((QRegion *)in_stack_fffffffffffffae0,(QRegion *)in_stack_fffffffffffffad8);
      QRegion::~QRegion(&local_348);
      (((anon_union_4_2_7218e939_for_QLoggingCategory_2 *)&in_RDI[3].super_QPaintDevice)->bools).
      enabledDebug._q_value._M_base._M_i = false;
      local_438 = QRegion::begin();
      lVar7 = QRegion::end();
      for (; local_438 != lVar7; local_438 = local_438 + 0x10) {
        QWidget::d_func((QWidget *)0x3a88de);
        std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::operator->
                  ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x3a88ea);
        QRectF::QRectF((QRectF *)in_stack_fffffffffffffaf0,(QRect *)in_stack_fffffffffffffae8);
        QGraphicsItem::update
                  ((QGraphicsItem *)in_stack_fffffffffffffb00,(QRectF *)in_stack_fffffffffffffaf8);
      }
    }
  }
  else {
    memset(local_1b8,0xaa,0x98);
    QVarLengthArray<QWidget_*,_16LL>::QVarLengthArray((QVarLengthArray<QWidget_*,_16LL> *)local_1b8)
    ;
    qVar8 = QList<QWidget_*>::size((QList<QWidget_*> *)&in_RDI[1].field_0x8);
    QVarLengthArray<QWidget_*,_16LL>::reserve
              ((QVarLengthArray<QWidget_*,_16LL> *)in_stack_fffffffffffffaf0,
               (qsizetype)in_stack_fffffffffffffae8);
    for (local_3f8 = 0; local_3f8 < (int)qVar8; local_3f8 = local_3f8 + 1) {
      ppQVar9 = QList<QWidget_*>::at
                          ((QList<QWidget_*> *)in_stack_fffffffffffffae0,
                           (qsizetype)in_stack_fffffffffffffad8);
      local_2f8 = *ppQVar9;
      QVarLengthArray<QWidget_*,_16LL>::operator<<
                ((QVarLengthArray<QWidget_*,_16LL> *)in_stack_fffffffffffffae0,
                 (QWidget **)in_stack_fffffffffffffad8);
      resetWidget((QWidgetRepaintManager *)in_stack_fffffffffffffae0,in_stack_fffffffffffffad8);
    }
    QList<QWidget_*>::clear((QList<QWidget_*> *)in_stack_fffffffffffffae0);
    for (local_3fc = 0; local_3fc < (int)qVar8; local_3fc = local_3fc + 1) {
      ppQVar15 = QVLABase<QWidget_*>::operator[]
                           ((QVLABase<QWidget_*> *)in_stack_fffffffffffffad8,0x3a83df);
      pQVar19 = *ppQVar15;
      in_stack_fffffffffffffb30 = QWidget::d_func((QWidget *)0x3a83f7);
      local_310 = QWidget::rect((QWidget *)in_stack_fffffffffffffaf8);
      QRegion::QRegion(&local_300,(QRect *)&local_310,Rectangle);
      QWidgetPrivate::sendPaintEvent(in_stack_fffffffffffffae8,(QRegion *)in_stack_fffffffffffffae0)
      ;
      QRegion::~QRegion(&local_300);
      if (pQVar19 != *(value_type *)in_RDI) {
        pQVar12 = QWidget::nativeParentWidget((QWidget *)in_stack_fffffffffffffae0);
        bVar2 = hasPlatformWindow((QWidget *)in_stack_fffffffffffffae0);
        if ((bVar2) || ((pQVar12 != (QWidget *)0x0 && (pQVar12 != *(QWidget **)in_RDI)))) {
          hasPlatformWindow((QWidget *)in_stack_fffffffffffffae0);
          QRegion::QRegion(&local_318);
          markNeedsFlush((QWidgetRepaintManager *)in_stack_fffffffffffffaf0,
                         (QWidget *)in_stack_fffffffffffffaf8,(QRegion *)in_stack_fffffffffffffae8);
          QRegion::~QRegion(&local_318);
        }
      }
    }
    flush((QWidgetRepaintManager *)in_stack_fffffffffffffb30);
    QVarLengthArray<QWidget_*,_16LL>::~QVarLengthArray
              ((QVarLengthArray<QWidget_*,_16LL> *)in_stack_fffffffffffffae0);
  }
  QVarLengthArray<QWidget_*,_32LL>::~QVarLengthArray
            ((QVarLengthArray<QWidget_*,_32LL> *)in_stack_fffffffffffffae0);
  QRegion::~QRegion(&local_290);
LAB_003a8d4a:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetRepaintManager::paintAndFlush()
{
    qCInfo(lcWidgetPainting) << "Painting and flushing dirty"
        << "top level" << dirty << "and dirty widgets" << dirtyWidgets;

    const bool updatesDisabled = !tlw->updatesEnabled();
    bool repaintAllWidgets = false;

    const QRect tlwRect = tlw->data->crect;
    if (!updatesDisabled && store->size() != tlwRect.size()) {
        QPlatformIntegration *integration = QGuiApplicationPrivate::platformIntegration();
        if (hasStaticContents() && !store->size().isEmpty()
            && integration->hasCapability(QPlatformIntegration::BackingStoreStaticContents)) {
            // Repaint existing dirty area and newly visible area.
            const QRect clipRect(QPoint(0, 0), store->size());
            const QRegion staticRegion(staticContents(nullptr, clipRect));
            QRegion newVisible(0, 0, tlwRect.width(), tlwRect.height());
            newVisible -= staticRegion;
            dirty += newVisible;
            store->setStaticContents(staticRegion);
        } else {
            // Repaint everything.
            dirty = QRegion(0, 0, tlwRect.width(), tlwRect.height());
            for (int i = 0; i < dirtyWidgets.size(); ++i)
                resetWidget(dirtyWidgets.at(i));
            dirtyWidgets.clear();
            repaintAllWidgets = true;
        }
    }

    if (store->size() != tlwRect.size())
        store->resize(tlwRect.size());

    if (updatesDisabled)
        return;

    // Contains everything that needs repaint.
    QRegion toClean(dirty);

    // Loop through all update() widgets and remove them from the list before they are
    // painted (in case someone calls update() in paintEvent). If the widget is opaque
    // and does not have transparent overlapping siblings, append it to the
    // opaqueNonOverlappedWidgets list and paint it directly without composition.
    QVarLengthArray<QWidget *, 32> opaqueNonOverlappedWidgets;
    for (int i = 0; i < dirtyWidgets.size(); ++i) {
        QWidget *w = dirtyWidgets.at(i);
        QWidgetPrivate *wd = w->d_func();
        if (wd->data.in_destructor)
            continue;

        // Clip with mask() and clipRect().
        wd->dirty &= wd->clipRect();
        wd->clipToEffectiveMask(wd->dirty);

        // Subtract opaque siblings and children.
        bool hasDirtySiblingsAbove = false;
        // We know for sure that the widget isn't overlapped if 'isMoved' is true.
        if (!wd->isMoved)
            wd->subtractOpaqueSiblings(wd->dirty, &hasDirtySiblingsAbove);

        // Make a copy of the widget's dirty region, to restore it in case there is an opaque
        // render-to-texture child that completely covers the widget, because otherwise the
        // render-to-texture child won't be visible, due to its parent widget not being redrawn
        // with a proper blending mask.
        const QRegion dirtyBeforeSubtractedOpaqueChildren = wd->dirty;

        // Scrolled and moved widgets must draw all children.
        if (!wd->isScrolled && !wd->isMoved)
            wd->subtractOpaqueChildren(wd->dirty, w->rect());

        if (wd->dirty.isEmpty() && wd->textureChildSeen)
            wd->dirty = dirtyBeforeSubtractedOpaqueChildren;

        if (wd->dirty.isEmpty()) {
            resetWidget(w);
            continue;
        }

        const QRegion widgetDirty(w != tlw ? wd->dirty.translated(w->mapTo(tlw, QPoint()))
                                           : wd->dirty);
        toClean += widgetDirty;

#if QT_CONFIG(graphicsview)
        if (tlw->d_func()->extra->proxyWidget) {
            resetWidget(w);
            continue;
        }
#endif

        if (!isDrawnInEffect(w) && !hasDirtySiblingsAbove && wd->isOpaque
                && !dirty.intersects(widgetDirty.boundingRect())) {
            opaqueNonOverlappedWidgets.append(w);
        } else {
            resetWidget(w);
            dirty += widgetDirty;
        }
    }
    dirtyWidgets.clear();

    // Find all render-to-texture child widgets (including self).
    // The search is cut at native widget boundaries, meaning that each native child widget
    // has its own list for the subtree below it.
    QTLWExtra *tlwExtra = tlw->d_func()->topData();
    tlwExtra->widgetTextures.clear();
    findAllTextureWidgetsRecursively(tlw, tlw);

    if (toClean.isEmpty()) {
        // Nothing to repaint. However renderToTexture widgets are handled
        // specially, they are not in the regular dirty list, in order to
        // prevent triggering unnecessary backingstore painting when only the
        // texture content changes. Check if we have such widgets in the special
        // dirty list.
        QVarLengthArray<QWidget *, 16> paintPending;
        const int numPaintPending = dirtyRenderToTextureWidgets.size();
        paintPending.reserve(numPaintPending);
        for (int i = 0; i < numPaintPending; ++i) {
            QWidget *w = dirtyRenderToTextureWidgets.at(i);
            paintPending << w;
            resetWidget(w);
        }
        dirtyRenderToTextureWidgets.clear();
        for (int i = 0; i < numPaintPending; ++i) {
            QWidget *w = paintPending[i];
            w->d_func()->sendPaintEvent(w->rect());
            if (w != tlw) {
                QWidget *npw = w->nativeParentWidget();
                if (hasPlatformWindow(w) || (npw && npw != tlw)) {
                    if (!hasPlatformWindow(w))
                        w = npw;
                    markNeedsFlush(w);
                }
            }
        }

        // We might have newly exposed areas on the screen if this function was
        // called from sync(QWidget *, QRegion)), so we have to make sure those
        // are flushed. We also need to composite the renderToTexture widgets.
        flush();

        return;
    }

    for (const auto &tl : tlwExtra->widgetTextures) {
        for (int i = 0; i < tl->count(); ++i) {
            QWidget *w = static_cast<QWidget *>(tl->source(i));
            if (dirtyRenderToTextureWidgets.contains(w)) {
                const QRect rect = tl->geometry(i); // mapped to the tlw already
                // Set a flag to indicate that the paint event for this
                // render-to-texture widget must not to be optimized away.
                w->d_func()->renderToTextureReallyDirty = 1;
                dirty += rect;
                toClean += rect;
            }
        }
    }
    for (int i = 0; i < dirtyRenderToTextureWidgets.size(); ++i)
        resetWidget(dirtyRenderToTextureWidgets.at(i));
    dirtyRenderToTextureWidgets.clear();

#if QT_CONFIG(graphicsview)
    if (tlw->d_func()->extra->proxyWidget) {
        updateStaticContentsSize();
        dirty = QRegion();
        updateRequestSent = false;
        for (const QRect &rect : toClean)
            tlw->d_func()->extra->proxyWidget->update(rect);
        return;
    }
#endif

    store->beginPaint(toClean);

    // Must do this before sending any paint events because
    // the size may change in the paint event.
    updateStaticContentsSize();
    const QRegion dirtyCopy(dirty);
    dirty = QRegion();
    updateRequestSent = false;

    // Paint opaque non overlapped widgets.
    for (int i = 0; i < opaqueNonOverlappedWidgets.size(); ++i) {
        QWidget *w = opaqueNonOverlappedWidgets[i];
        QWidgetPrivate *wd = w->d_func();

        QWidgetPrivate::DrawWidgetFlags flags = QWidgetPrivate::DrawRecursive;
        // Scrolled and moved widgets must draw all children.
        if (!wd->isScrolled && !wd->isMoved)
            flags |= QWidgetPrivate::DontDrawOpaqueChildren;
        if (w == tlw)
            flags |= QWidgetPrivate::DrawAsRoot;

        QRegion toBePainted(wd->dirty);
        resetWidget(w);

        QPoint offset;
        if (w != tlw)
            offset += w->mapTo(tlw, QPoint());
        wd->drawWidget(store->paintDevice(), toBePainted, offset, flags, nullptr, this);
    }

    // Paint the rest with composition.
    if (repaintAllWidgets || !dirtyCopy.isEmpty()) {
        QWidgetPrivate::DrawWidgetFlags flags = QWidgetPrivate::DrawAsRoot | QWidgetPrivate::DrawRecursive
                | QWidgetPrivate::UseEffectRegionBounds;
        tlw->d_func()->drawWidget(store->paintDevice(), dirtyCopy, QPoint(), flags, nullptr, this);
    }

    store->endPaint();

    flush();
}